

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManCountChoices(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (iVar2 = 0, p->pNexts != (int *)0x0)) {
    iVar2 = 0;
    for (lVar3 = 0; lVar3 < p->nObjs; lVar3 = lVar3 + 1) {
      pGVar1 = Gia_ManObj(p,(int)lVar3);
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return iVar2;
      }
      iVar2 = iVar2 + (uint)(0 < p->pNexts[lVar3]);
    }
  }
  return iVar2;
}

Assistant:

int Gia_ManCountChoices( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pReprs == NULL || p->pNexts == NULL )
        return 0;
    Gia_ManForEachObj( p, pObj, i )
        Counter += (int)(Gia_ObjNext( p, i ) > 0);
    return Counter;
}